

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O1

optional<unsigned_long> __thiscall
cappuccino::lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_find
          (lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,peek peek)

{
  _Storage<unsigned_long,_true> _Var1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  uint unaff_EBX;
  __off64_t *__offout;
  size_t in_R9;
  __node_base _Var3;
  long lVar4;
  optional<unsigned_long> oVar5;
  
  __offout = (__off64_t *)*key;
  _Var3._M_nxt = (_Hash_node_base *)0x0;
  _Var1 = (_Storage<unsigned_long,_true>)
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_find_before_node
                    ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 0x48),(ulong)__offout % *(ulong *)(this + 0x50),key,
                     (__hash_code)__offout);
  if ((__node_base_ptr)_Var1._M_value != (__node_base_ptr)0x0) {
    _Var3._M_nxt = *(_Hash_node_base **)_Var1;
  }
  if (_Var3._M_nxt == (_Hash_node_base *)0x0) {
    uVar2 = 0;
  }
  else {
    lVar4 = (long)_Var3._M_nxt[2]._M_nxt * 0x18 + *(long *)(this + 0x30);
    uVar2 = extraout_RDX;
    if (peek == no) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x80),
                 (int)*(undefined8 *)(this + 0x80),(__off64_t *)(this + 0x80),
                 (int)*(undefined8 *)(lVar4 + 8),__offout,in_R9,unaff_EBX);
      uVar2 = extraout_RDX_00;
    }
    _Var1 = (_Storage<unsigned_long,_true>)
            ((_Storage<unsigned_long,_true> *)(lVar4 + 0x10))->_M_value;
    uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
  }
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto do_find(const key_type& key, peek peek) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];
            // Don't update the elements access in the LRU if peeking.
            if (peek == peek::no)
            {
                do_access(e);
            }
            return {e.m_value};
        }

        return {};
    }